

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_c57608::HandleScriptMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  string *psVar7;
  cmGlobalGenerator *this;
  int iVar8;
  ulong uVar9;
  pointer pbVar10;
  pointer __args_1;
  bool bVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool all_components;
  bool exclude_from_all;
  string script;
  string component;
  Helper helper;
  undefined1 local_166;
  bool local_165;
  uint local_164;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_160;
  undefined8 local_148;
  undefined1 *local_140;
  undefined8 local_138;
  size_type local_130;
  pointer local_128;
  undefined8 local_120;
  cmExecutionStatus *local_118;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_110;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_108;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string *local_88;
  string local_80;
  Helper local_60;
  
  local_118 = status;
  Helper::Helper(&local_60,status);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_60.DefaultComponentName._M_dataplus._M_p,
             local_60.DefaultComponentName._M_dataplus._M_p +
             local_60.DefaultComponentName._M_string_length);
  iVar8 = 0;
  local_165 = false;
  local_166 = '\0';
  __args_1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != __args_1) {
    iVar8 = 0;
    uVar9 = 0;
    do {
      iVar5 = std::__cxx11::string::compare((char *)(__args_1 + uVar9));
      if ((iVar5 == 0) &&
         (uVar9 + 1 <
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5))) {
        std::__cxx11::string::_M_assign((string *)&local_e0);
        iVar8 = iVar8 + 1;
        uVar9 = uVar9 + 1;
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9));
      if (iVar5 == 0) {
        local_165 = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9));
        if (iVar5 == 0) {
          local_166 = '\x01';
        }
      }
      uVar9 = uVar9 + 1;
      __args_1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar9 < (ulong)((long)pbVar10 - (long)__args_1 >> 5));
  }
  if (iVar8 < 2) {
    if ((iVar8 == 1) && (local_166 != '\0')) {
      local_160.first._M_len = (size_t)&local_160.second;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_160,"ALL_COMPONENTS and COMPONENT are mutually exclusive","");
      std::__cxx11::string::_M_assign((string *)&local_118->Error);
      goto LAB_002f100f;
    }
    bVar11 = __args_1 == pbVar10;
    if (bVar11) {
      local_164 = 0;
      bVar4 = false;
    }
    else {
      local_88 = (string *)&local_118->Error;
      bVar4 = false;
      local_164 = 0;
      do {
        iVar8 = std::__cxx11::string::compare((char *)__args_1);
        if (iVar8 == 0) {
          bVar2 = true;
          local_164 = 0;
          bVar4 = true;
        }
        else {
          uVar6 = std::__cxx11::string::compare((char *)__args_1);
          bVar2 = true;
          if ((int)uVar6 == 0) {
            bVar4 = false;
            local_164 = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)__args_1);
            pcVar3 = local_60.Makefile;
            if (iVar8 == 0) {
              local_164 = 0;
            }
            else {
              if (!bVar4) {
                if ((local_164 & 1) != 0) {
                  local_100._M_dataplus._M_p._0_1_ = 1;
                  cmMakefile::GetBacktrace(local_60.Makefile);
                  std::
                  make_unique<cmInstallScriptGenerator,std::__cxx11::string_const&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                            (&local_c0,(bool *)__args_1,&local_100,(bool *)&local_e0,&local_165,
                             (cmListFileBacktrace *)&local_166);
                  local_110._M_head_impl = (cmInstallGenerator *)local_c0._M_dataplus._M_p;
                  local_c0._M_dataplus._M_p = (pointer)0x0;
                  cmMakefile::AddInstallGenerator
                            (pcVar3,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                     *)&local_110);
                  if (local_110._M_head_impl != (cmInstallGenerator *)0x0) {
                    (*((local_110._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1]
                    )();
                  }
                  local_110._M_head_impl = (cmInstallGenerator *)0x0;
                  if ((long *)local_c0._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_c0._M_dataplus._M_p + 8))();
                  }
                  local_c0._M_dataplus._M_p = (pointer)0x0;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160.first._M_str !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_160.first._M_str);
                  }
                  local_164 = 0;
                }
                goto LAB_002f14ac;
              }
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              pcVar1 = (__args_1->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,pcVar1,pcVar1 + __args_1->_M_string_length);
              local_160.first._M_len = local_100._M_string_length;
              local_160.first._M_str = local_100._M_dataplus._M_p;
              __str._M_str = "$<INSTALL_PREFIX>";
              __str._M_len = 0x11;
              iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                (&local_160.first,0,0x11,__str);
              if (iVar8 != 0) {
                bVar4 = cmsys::SystemTools::FileIsFullPath(&local_100);
                if (!bVar4) {
                  psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_60.Makefile);
                  local_160.first._M_str = (psVar7->_M_dataplus)._M_p;
                  local_160.first._M_len = psVar7->_M_string_length;
                  local_160.second =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_c0._M_dataplus._M_p = (pointer)0x0;
                  local_c0._M_string_length = 1;
                  local_140 = (undefined1 *)((long)&local_c0.field_2 + 8);
                  local_c0.field_2._M_local_buf[8] = '/';
                  local_148 = 1;
                  local_138 = 0;
                  local_128 = (__args_1->_M_dataplus)._M_p;
                  local_130 = __args_1->_M_string_length;
                  local_120 = 0;
                  views._M_len = 3;
                  views._M_array = &local_160;
                  local_c0.field_2._M_allocated_capacity = (size_type)local_140;
                  cmCatViews(&local_80,views);
                  std::__cxx11::string::operator=((string *)&local_100,(string *)&local_80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_)
                      != &local_80.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                             local_80._M_dataplus._M_p._0_1_),
                                    local_80.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar4 = cmsys::SystemTools::FileIsDirectory(&local_100);
                if (bVar4) {
                  local_160.first._M_len = (size_t)&local_160.second;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_160,"given a directory as value of SCRIPT argument.",
                             "");
                  std::__cxx11::string::_M_assign(local_88);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      local_160.first._M_len != &local_160.second) {
                    operator_delete((void *)local_160.first._M_len,
                                    (ulong)((long)&((local_160.second)->_M_dataplus)._M_p + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100._M_dataplus._M_p != &local_100.field_2) {
                    operator_delete(local_100._M_dataplus._M_p,
                                    local_100.field_2._M_allocated_capacity + 1);
                  }
                  bVar2 = false;
                  goto LAB_002f14a9;
                }
              }
              pcVar3 = local_60.Makefile;
              local_80._M_dataplus._M_p._0_1_ = 0;
              cmMakefile::GetBacktrace(local_60.Makefile);
              std::
              make_unique<cmInstallScriptGenerator,std::__cxx11::string&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                        (&local_c0,(bool *)&local_100,&local_80,(bool *)&local_e0,&local_165,
                         (cmListFileBacktrace *)&local_166);
              local_108._M_head_impl = (cmInstallGenerator *)local_c0._M_dataplus._M_p;
              local_c0._M_dataplus._M_p = (pointer)0x0;
              cmMakefile::AddInstallGenerator
                        (pcVar3,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                 *)&local_108);
              if (local_108._M_head_impl != (cmInstallGenerator *)0x0) {
                (*((local_108._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
              }
              local_108._M_head_impl = (cmInstallGenerator *)0x0;
              if ((long *)local_c0._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_c0._M_dataplus._M_p + 8))();
              }
              local_c0._M_dataplus._M_p = (pointer)0x0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160.first._M_str !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160.first._M_str);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
            }
LAB_002f14a9:
            bVar4 = false;
          }
        }
LAB_002f14ac:
        if (!bVar2) break;
        __args_1 = __args_1 + 1;
        bVar11 = __args_1 == pbVar10;
      } while (!bVar11);
    }
    if (bVar11) {
      if (bVar4) {
        local_160.first._M_len = (size_t)&local_160.second;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,"given no value for SCRIPT argument.","");
        std::__cxx11::string::_M_assign((string *)&local_118->Error);
      }
      else {
        if ((local_164 & 1) == 0) {
          this = cmMakefile::GetGlobalGenerator(local_60.Makefile);
          bVar11 = true;
          cmGlobalGenerator::AddInstallComponent(this,&local_e0);
          goto LAB_002f1028;
        }
        local_160.first._M_len = (size_t)&local_160.second;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,"given no value for CODE argument.","");
        std::__cxx11::string::_M_assign((string *)&local_118->Error);
      }
      goto LAB_002f100f;
    }
  }
  else {
    local_160.first._M_len = (size_t)&local_160.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,"");
    std::__cxx11::string::_M_assign((string *)&local_118->Error);
LAB_002f100f:
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_160.first._M_len
        != &local_160.second) {
      operator_delete((void *)local_160.first._M_len,
                      (ulong)((long)&((local_160.second)->_M_dataplus)._M_p + 1));
    }
  }
  bVar11 = false;
LAB_002f1028:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.DefaultComponentName._M_dataplus._M_p != &local_60.DefaultComponentName.field_2) {
    operator_delete(local_60.DefaultComponentName._M_dataplus._M_p,
                    local_60.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar11;
}

Assistant:

bool HandleScriptMode(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  Helper helper(status);

  std::string component = helper.DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;
  bool all_components = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    } else if (args[i] == "ALL_COMPONENTS") {
      all_components = true;
    }
  }

  if (componentCount > 1) {
    status.SetError("given more than one COMPONENT for the SCRIPT or CODE "
                    "signature of the INSTALL command. "
                    "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  if (all_components && componentCount == 1) {
    status.SetError("ALL_COMPONENTS and COMPONENT are mutually exclusive");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmHasLiteralPrefix(script, "$<INSTALL_PREFIX>")) {
        if (!cmSystemTools::FileIsFullPath(script)) {
          script =
            cmStrCat(helper.Makefile->GetCurrentSourceDirectory(), '/', arg);
        }
        if (cmSystemTools::FileIsDirectory(script)) {
          status.SetError("given a directory as value of SCRIPT argument.");
          return false;
        }
      }
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          script, false, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          code, true, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    }
  }

  if (doing_script) {
    status.SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    status.SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}